

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O0

void png_do_expand(png_row_infop row_info,png_bytep row,png_const_color_16p trans_color)

{
  png_byte pVar1;
  png_uint_16 pVar2;
  png_uint_16 pVar3;
  png_uint_16 pVar4;
  png_uint_16 pVar5;
  png_uint_16 pVar6;
  png_uint_16 pVar7;
  uint uVar8;
  png_bytep ppVar9;
  uint uVar10;
  png_byte *ppVar11;
  ulong local_70;
  ulong local_68;
  uint local_5c;
  png_byte blue_low;
  png_byte green_low;
  png_byte red_low;
  png_byte blue_high;
  png_byte green_high;
  png_byte red_high;
  png_byte blue;
  png_byte green;
  png_byte red;
  uint gray_low;
  uint gray_high;
  uint gray;
  png_uint_32 row_width;
  png_uint_32 i;
  png_bytep dp;
  png_bytep sp;
  int value;
  int shift;
  png_const_color_16p trans_color_local;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  uVar8 = row_info->width;
  if (row_info->color_type == '\0') {
    if (trans_color == (png_const_color_16p)0x0) {
      local_5c = 0;
    }
    else {
      local_5c = (uint)trans_color->gray;
    }
    gray_low = local_5c;
    if (row_info->bit_depth < 8) {
      pVar1 = row_info->bit_depth;
      if (pVar1 == '\x01') {
        gray_low = (local_5c & 1) * 0xff;
        dp = row + (uVar8 - 1 >> 3);
        _row_width = row + uVar8;
        sp._4_4_ = 7 - (uVar8 + 7 & 7);
        for (gray = 0; _row_width = _row_width + -1, gray < uVar8; gray = gray + 1) {
          if (((int)(uint)*dp >> ((byte)sp._4_4_ & 0x1f) & 1U) == 0) {
            *_row_width = '\0';
          }
          else {
            *_row_width = 0xff;
          }
          if (sp._4_4_ == 7) {
            sp._4_4_ = 0;
            dp = dp + -1;
          }
          else {
            sp._4_4_ = sp._4_4_ + 1;
          }
        }
      }
      else if (pVar1 == '\x02') {
        gray_low = (local_5c & 3) * 0x55;
        dp = row + (uVar8 - 1 >> 2);
        _row_width = row + uVar8;
        sp._4_4_ = (3 - (uVar8 + 3 & 3)) * 2;
        for (gray = 0; _row_width = _row_width + -1, gray < uVar8; gray = gray + 1) {
          uVar10 = (int)(uint)*dp >> ((byte)sp._4_4_ & 0x1f) & 3;
          *_row_width = (byte)uVar10 | (byte)(uVar10 << 2) | (byte)(uVar10 << 4) |
                        (byte)(uVar10 << 6);
          if (sp._4_4_ == 6) {
            sp._4_4_ = 0;
            dp = dp + -1;
          }
          else {
            sp._4_4_ = sp._4_4_ + 2;
          }
        }
      }
      else if (pVar1 == '\x04') {
        gray_low = (local_5c & 0xf) * 0x11;
        dp = row + (uVar8 - 1 >> 1);
        _row_width = row + uVar8;
        sp._4_4_ = (1 - (uVar8 + 1 & 1)) * 4;
        for (gray = 0; _row_width = _row_width + -1, gray < uVar8; gray = gray + 1) {
          uVar10 = (int)(uint)*dp >> ((byte)sp._4_4_ & 0x1f) & 0xf;
          *_row_width = (byte)uVar10 | (byte)(uVar10 << 4);
          if (sp._4_4_ == 4) {
            sp._4_4_ = 0;
            dp = dp + -1;
          }
          else {
            sp._4_4_ = 4;
          }
        }
      }
      row_info->bit_depth = '\b';
      row_info->pixel_depth = '\b';
      row_info->rowbytes = (ulong)uVar8;
    }
    if (trans_color != (png_const_color_16p)0x0) {
      if (row_info->bit_depth == '\b') {
        dp = row + uVar8;
        gray = 0;
        ppVar9 = row + (ulong)uVar8 * 2;
        while( true ) {
          dp = dp + -1;
          _row_width = ppVar9 + -1;
          if (uVar8 <= gray) break;
          if ((uint)*dp == (gray_low & 0xff)) {
            *_row_width = '\0';
          }
          else {
            *_row_width = 0xff;
          }
          _row_width = ppVar9 + -2;
          *_row_width = *dp;
          gray = gray + 1;
          ppVar9 = _row_width;
        }
      }
      else if (row_info->bit_depth == '\x10') {
        dp = row + (row_info->rowbytes - 1);
        _row_width = row + row_info->rowbytes * 2 + -1;
        for (gray = 0; ppVar9 = _row_width, gray < uVar8; gray = gray + 1) {
          if (((uint)dp[-1] == gray_low >> 8) && ((uint)*dp == (gray_low & 0xff))) {
            *_row_width = '\0';
            _row_width[-1] = '\0';
          }
          else {
            *_row_width = 0xff;
            _row_width[-1] = 0xff;
          }
          _row_width = _row_width + -2;
          ppVar11 = dp + -1;
          *_row_width = *dp;
          dp = dp + -2;
          _row_width = ppVar9 + -4;
          ppVar9[-3] = *ppVar11;
        }
      }
      row_info->color_type = '\x04';
      row_info->channels = '\x02';
      row_info->pixel_depth = row_info->bit_depth << 1;
      if (row_info->pixel_depth < 8) {
        local_68 = (ulong)uVar8 * (ulong)row_info->pixel_depth + 7 >> 3;
      }
      else {
        local_68 = (ulong)uVar8 * (ulong)(row_info->pixel_depth >> 3);
      }
      row_info->rowbytes = local_68;
    }
  }
  else if ((row_info->color_type == '\x02') && (trans_color != (png_const_color_16p)0x0)) {
    if (row_info->bit_depth == '\b') {
      pVar2 = trans_color->red;
      pVar3 = trans_color->green;
      pVar4 = trans_color->blue;
      dp = row + (row_info->rowbytes - 1);
      _row_width = row + (ulong)uVar8 * 4 + -1;
      for (gray = 0; ppVar9 = _row_width, gray < uVar8; gray = gray + 1) {
        if (((dp[-2] == (png_byte)pVar2) && (dp[-1] == (png_byte)pVar3)) && (*dp == (png_byte)pVar4)
           ) {
          *_row_width = '\0';
        }
        else {
          *_row_width = 0xff;
        }
        _row_width = _row_width + -1;
        *_row_width = *dp;
        ppVar11 = dp + -2;
        ppVar9[-2] = dp[-1];
        dp = dp + -3;
        _row_width = ppVar9 + -4;
        ppVar9[-3] = *ppVar11;
      }
    }
    else if (row_info->bit_depth == '\x10') {
      pVar2 = trans_color->red;
      pVar3 = trans_color->green;
      pVar4 = trans_color->blue;
      pVar5 = trans_color->red;
      pVar6 = trans_color->green;
      pVar7 = trans_color->blue;
      dp = row + (row_info->rowbytes - 1);
      _row_width = row + (ulong)uVar8 * 8 + -1;
      for (gray = 0; ppVar9 = _row_width, gray < uVar8; gray = gray + 1) {
        if (((((dp[-5] == (png_byte)(pVar2 >> 8)) && (dp[-4] == (png_byte)pVar5)) &&
             (dp[-3] == (png_byte)(pVar3 >> 8))) &&
            ((dp[-2] == (png_byte)pVar6 && (dp[-1] == (png_byte)(pVar4 >> 8))))) &&
           (*dp == (png_byte)pVar7)) {
          *_row_width = '\0';
          _row_width[-1] = '\0';
        }
        else {
          *_row_width = 0xff;
          _row_width[-1] = 0xff;
        }
        _row_width = _row_width + -2;
        *_row_width = *dp;
        ppVar9[-3] = dp[-1];
        ppVar9[-4] = dp[-2];
        ppVar9[-5] = dp[-3];
        ppVar11 = dp + -5;
        ppVar9[-6] = dp[-4];
        dp = dp + -6;
        _row_width = ppVar9 + -8;
        ppVar9[-7] = *ppVar11;
      }
    }
    row_info->color_type = '\x06';
    row_info->channels = '\x04';
    row_info->pixel_depth = row_info->bit_depth << 2;
    if (row_info->pixel_depth < 8) {
      local_70 = (ulong)uVar8 * (ulong)row_info->pixel_depth + 7 >> 3;
    }
    else {
      local_70 = (ulong)uVar8 * (ulong)(row_info->pixel_depth >> 3);
    }
    row_info->rowbytes = local_70;
  }
  return;
}

Assistant:

static void
png_do_expand(png_row_infop row_info, png_bytep row,
    png_const_color_16p trans_color)
{
   int shift, value;
   png_bytep sp, dp;
   png_uint_32 i;
   png_uint_32 row_width=row_info->width;

   png_debug(1, "in png_do_expand");

   {
      if (row_info->color_type == PNG_COLOR_TYPE_GRAY)
      {
         unsigned int gray = trans_color != NULL ? trans_color->gray : 0;

         if (row_info->bit_depth < 8)
         {
            switch (row_info->bit_depth)
            {
               case 1:
               {
                  gray = (gray & 0x01) * 0xff;
                  sp = row + (png_size_t)((row_width - 1) >> 3);
                  dp = row + (png_size_t)row_width - 1;
                  shift = 7 - (int)((row_width + 7) & 0x07);
                  for (i = 0; i < row_width; i++)
                  {
                     if ((*sp >> shift) & 0x01)
                        *dp = 0xff;

                     else
                        *dp = 0;

                     if (shift == 7)
                     {
                        shift = 0;
                        sp--;
                     }

                     else
                        shift++;

                     dp--;
                  }
                  break;
               }

               case 2:
               {
                  gray = (gray & 0x03) * 0x55;
                  sp = row + (png_size_t)((row_width - 1) >> 2);
                  dp = row + (png_size_t)row_width - 1;
                  shift = (int)((3 - ((row_width + 3) & 0x03)) << 1);
                  for (i = 0; i < row_width; i++)
                  {
                     value = (*sp >> shift) & 0x03;
                     *dp = (png_byte)(value | (value << 2) | (value << 4) |
                        (value << 6));
                     if (shift == 6)
                     {
                        shift = 0;
                        sp--;
                     }

                     else
                        shift += 2;

                     dp--;
                  }
                  break;
               }

               case 4:
               {
                  gray = (gray & 0x0f) * 0x11;
                  sp = row + (png_size_t)((row_width - 1) >> 1);
                  dp = row + (png_size_t)row_width - 1;
                  shift = (int)((1 - ((row_width + 1) & 0x01)) << 2);
                  for (i = 0; i < row_width; i++)
                  {
                     value = (*sp >> shift) & 0x0f;
                     *dp = (png_byte)(value | (value << 4));
                     if (shift == 4)
                     {
                        shift = 0;
                        sp--;
                     }

                     else
                        shift = 4;

                     dp--;
                  }
                  break;
               }

               default:
                  break;
            }

            row_info->bit_depth = 8;
            row_info->pixel_depth = 8;
            row_info->rowbytes = row_width;
         }

         if (trans_color != NULL)
         {
            if (row_info->bit_depth == 8)
            {
               gray = gray & 0xff;
               sp = row + (png_size_t)row_width - 1;
               dp = row + ((png_size_t)row_width << 1) - 1;

               for (i = 0; i < row_width; i++)
               {
                  if ((*sp & 0xffU) == gray)
                     *dp-- = 0;

                  else
                     *dp-- = 0xff;

                  *dp-- = *sp--;
               }
            }

            else if (row_info->bit_depth == 16)
            {
               unsigned int gray_high = (gray >> 8) & 0xff;
               unsigned int gray_low = gray & 0xff;
               sp = row + row_info->rowbytes - 1;
               dp = row + (row_info->rowbytes << 1) - 1;
               for (i = 0; i < row_width; i++)
               {
                  if ((*(sp - 1) & 0xffU) == gray_high &&
                      (*(sp) & 0xffU) == gray_low)
                  {
                     *dp-- = 0;
                     *dp-- = 0;
                  }

                  else
                  {
                     *dp-- = 0xff;
                     *dp-- = 0xff;
                  }

                  *dp-- = *sp--;
                  *dp-- = *sp--;
               }
            }

            row_info->color_type = PNG_COLOR_TYPE_GRAY_ALPHA;
            row_info->channels = 2;
            row_info->pixel_depth = (png_byte)(row_info->bit_depth << 1);
            row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth,
                row_width);
         }
      }
      else if (row_info->color_type == PNG_COLOR_TYPE_RGB &&
          trans_color != NULL)
      {
         if (row_info->bit_depth == 8)
         {
            png_byte red = (png_byte)(trans_color->red & 0xff);
            png_byte green = (png_byte)(trans_color->green & 0xff);
            png_byte blue = (png_byte)(trans_color->blue & 0xff);
            sp = row + (png_size_t)row_info->rowbytes - 1;
            dp = row + ((png_size_t)row_width << 2) - 1;
            for (i = 0; i < row_width; i++)
            {
               if (*(sp - 2) == red && *(sp - 1) == green && *(sp) == blue)
                  *dp-- = 0;

               else
                  *dp-- = 0xff;

               *dp-- = *sp--;
               *dp-- = *sp--;
               *dp-- = *sp--;
            }
         }
         else if (row_info->bit_depth == 16)
         {
            png_byte red_high = (png_byte)((trans_color->red >> 8) & 0xff);
            png_byte green_high = (png_byte)((trans_color->green >> 8) & 0xff);
            png_byte blue_high = (png_byte)((trans_color->blue >> 8) & 0xff);
            png_byte red_low = (png_byte)(trans_color->red & 0xff);
            png_byte green_low = (png_byte)(trans_color->green & 0xff);
            png_byte blue_low = (png_byte)(trans_color->blue & 0xff);
            sp = row + row_info->rowbytes - 1;
            dp = row + ((png_size_t)row_width << 3) - 1;
            for (i = 0; i < row_width; i++)
            {
               if (*(sp - 5) == red_high &&
                   *(sp - 4) == red_low &&
                   *(sp - 3) == green_high &&
                   *(sp - 2) == green_low &&
                   *(sp - 1) == blue_high &&
                   *(sp    ) == blue_low)
               {
                  *dp-- = 0;
                  *dp-- = 0;
               }

               else
               {
                  *dp-- = 0xff;
                  *dp-- = 0xff;
               }

               *dp-- = *sp--;
               *dp-- = *sp--;
               *dp-- = *sp--;
               *dp-- = *sp--;
               *dp-- = *sp--;
               *dp-- = *sp--;
            }
         }
         row_info->color_type = PNG_COLOR_TYPE_RGB_ALPHA;
         row_info->channels = 4;
         row_info->pixel_depth = (png_byte)(row_info->bit_depth << 2);
         row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth, row_width);
      }
   }
}